

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void scale_to(values_t *values,double length)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  pdVar3 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pdVar2 - (long)pdVar3 != 0) {
    lVar4 = (long)pdVar2 - (long)pdVar3 >> 3;
    lVar6 = 0;
    lVar5 = 0;
    lVar8 = 0;
    do {
      dVar1 = pdVar3[lVar5];
      lVar7 = lVar5;
      if (pdVar3[lVar8] <= dVar1) {
        lVar7 = lVar8;
      }
      lVar8 = lVar5;
      if (dVar1 < pdVar3[lVar6] || dVar1 == pdVar3[lVar6]) {
        lVar8 = lVar6;
      }
      lVar6 = lVar8;
      lVar5 = lVar5 + 1;
      lVar8 = lVar7;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    if (pdVar2 != pdVar3) {
      dVar1 = pdVar3[lVar7];
      dVar9 = pdVar3[lVar6] - dVar1;
      do {
        dVar10 = 0.0;
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          dVar10 = ((*pdVar3 - dVar1) * length) / dVar9;
        }
        *pdVar3 = dVar10;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar2);
    }
  }
  return;
}

Assistant:

void scale_to(values_t& values, double length = 1.0)
{
    size_t min_v = 0;
    size_t max_v = 0;
    for (values_t::size_type i = 0; i < values.size(); i++)
    {
        if (values[min_v] > values[i])
        {
            min_v = i;
        }
        if (values[max_v] < values[i])
        {
            max_v = i;
        }
    }

    double min = values[min_v];
    double max = values[max_v] - min;
    for (values_t::iterator i = values.begin(); i != values.end(); i++)
    {
        if (0 != max)
        {
            *i = length*(*i - min)/max;
        } else
        {
            *i = 0;
        }
    }
}